

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

double __thiscall
TPZMatrix<double>::MatrixNorm(TPZMatrix<double> *this,int p,int64_t numiter,REAL tol)

{
  bool bVar1;
  int64_t iVar2;
  int64_t iVar3;
  ostream *poVar4;
  void *this_00;
  double *pdVar5;
  long in_RDX;
  int in_ESI;
  TPZBaseMatrix *in_RDI;
  double in_XMM0_Qa;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  bool result;
  TPZVec<double> EigenVal;
  double sum_2;
  TPZVec<double> ROW;
  int64_t k;
  int64_t j_2;
  int64_t i_2;
  TPZFMatrix<double> transp;
  REAL sum_1;
  int64_t j_1;
  int64_t i_1;
  double max_1;
  REAL sum;
  int64_t j;
  int64_t i;
  double max;
  int64_t n;
  int64_t in_stack_fffffffffffffdd8;
  TPZVec<double> *in_stack_fffffffffffffde0;
  int64_t in_stack_fffffffffffffdf0;
  int64_t in_stack_fffffffffffffdf8;
  TPZFMatrix<double> *in_stack_fffffffffffffe00;
  int64_t in_stack_fffffffffffffe10;
  int64_t in_stack_fffffffffffffe18;
  TPZFMatrix<double> *in_stack_fffffffffffffe20;
  TPZVec<double> local_170;
  double local_150;
  TPZVec<double> local_148;
  int64_t local_118;
  long local_110;
  long local_108;
  double local_70;
  long local_68;
  long local_60;
  double local_58;
  TPZVec<double> *in_stack_ffffffffffffffb0;
  double dVar6;
  REAL *in_stack_ffffffffffffffb8;
  long lVar7;
  int64_t *in_stack_ffffffffffffffc0;
  long lVar8;
  TPZMatrix<double> *in_stack_ffffffffffffffc8;
  double local_8;
  
  iVar2 = TPZBaseMatrix::Rows(in_RDI);
  if (iVar2 == 0) {
    local_8 = 0.0;
  }
  else {
    iVar3 = TPZBaseMatrix::Cols(in_RDI);
    if (iVar2 != iVar3) {
      poVar4 = std::operator<<((ostream *)&std::cerr,
                               "TVar TPZMatrix<>::MatrixNorm(int, int64_t, REAL) const [TVar = double]"
                              );
      poVar4 = std::operator<<(poVar4," - matrix must be square - Rows() = ");
      iVar3 = TPZBaseMatrix::Rows(in_RDI);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
      poVar4 = std::operator<<(poVar4," - Cols() = ");
      iVar3 = TPZBaseMatrix::Cols(in_RDI);
      this_00 = (void *)std::ostream::operator<<(poVar4,iVar3);
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    }
    if (in_ESI == 0) {
      local_8 = 0.0;
      for (lVar8 = 0; lVar8 < iVar2; lVar8 = lVar8 + 1) {
        dVar6 = 0.0;
        for (lVar7 = 0; lVar7 < iVar2; lVar7 = lVar7 + 1) {
          (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x21])(in_RDI,lVar8,lVar7);
          dVar6 = ABS(extraout_XMM0_Qa) + dVar6;
        }
        if (ABS(local_8) < dVar6) {
          local_8 = dVar6;
        }
      }
    }
    else if (in_ESI == 1) {
      local_58 = 0.0;
      for (local_60 = 0; local_60 < iVar2; local_60 = local_60 + 1) {
        local_70 = 0.0;
        for (local_68 = 0; local_68 < iVar2; local_68 = local_68 + 1) {
          (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x21])(in_RDI,local_68,local_60);
          local_70 = ABS(extraout_XMM0_Qa_00) + local_70;
        }
        if (ABS(local_58) < local_70) {
          local_58 = local_70;
        }
      }
      local_8 = local_58;
    }
    else if (in_ESI == 2) {
      TPZFMatrix<double>::TPZFMatrix
                (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
      for (local_108 = 0; local_108 < iVar2; local_108 = local_108 + 1) {
        for (local_110 = 0; local_110 < iVar2; local_110 = local_110 + 1) {
          (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x21])(in_RDI,local_110,local_108);
          pdVar5 = TPZFMatrix<double>::operator()
                             (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
                              in_stack_fffffffffffffdf0);
          *pdVar5 = extraout_XMM0_Qa_01;
        }
      }
      TPZVec<double>::TPZVec(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
      for (local_108 = 0; local_108 < iVar2; local_108 = local_108 + 1) {
        for (local_110 = 0; local_110 < iVar2; local_110 = local_110 + 1) {
          pdVar5 = TPZFMatrix<double>::operator()
                             (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
                              in_stack_fffffffffffffdf0);
          dVar6 = *pdVar5;
          pdVar5 = TPZVec<double>::operator[](&local_148,local_110);
          *pdVar5 = dVar6;
        }
        for (local_110 = 0; local_110 < iVar2; local_110 = local_110 + 1) {
          local_150 = 0.0;
          for (local_118 = 0; local_118 < iVar2; local_118 = local_118 + 1) {
            pdVar5 = TPZVec<double>::operator[](&local_148,local_118);
            dVar6 = *pdVar5;
            (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x21])(in_RDI,local_118,local_110);
            local_150 = dVar6 * extraout_XMM0_Qa_02 + local_150;
          }
          dVar6 = local_150;
          pdVar5 = TPZFMatrix<double>::operator()
                             (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
                              in_stack_fffffffffffffdf0);
          *pdVar5 = dVar6;
        }
      }
      TPZVec<double>::TPZVec(&local_170);
      bVar1 = SolveEigenvaluesJacobi
                        (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                         in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
      if (!bVar1) {
        poVar4 = std::operator<<((ostream *)&std::cerr,
                                 "TVar TPZMatrix<>::MatrixNorm(int, int64_t, REAL) const [TVar = double]"
                                );
        poVar4 = std::operator<<(poVar4," - it was not possible to find Eigenvalues. Iterations = ")
        ;
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,in_RDX);
        poVar4 = std::operator<<(poVar4," - error found = ");
        in_stack_fffffffffffffde0 = (TPZVec<double> *)std::ostream::operator<<(poVar4,in_XMM0_Qa);
        std::ostream::operator<<(in_stack_fffffffffffffde0,std::endl<char,std::char_traits<char>>);
      }
      pdVar5 = TPZVec<double>::operator[](&local_170,0);
      local_8 = sqrt(*pdVar5);
      TPZVec<double>::~TPZVec(in_stack_fffffffffffffde0);
      TPZVec<double>::~TPZVec(in_stack_fffffffffffffde0);
      TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)0x12d782b);
    }
    else {
      poVar4 = std::operator<<((ostream *)&std::cerr,
                               "TVar TPZMatrix<>::MatrixNorm(int, int64_t, REAL) const [TVar = double]"
                              );
      poVar4 = std::operator<<(poVar4," p = ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,in_ESI);
      poVar4 = std::operator<<(poVar4," is not a correct option");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      local_8 = 0.0;
    }
  }
  return local_8;
}

Assistant:

TVar TPZMatrix<TVar>::MatrixNorm(int p, int64_t numiter, REAL tol) const{
	const int64_t n = this->Rows();
	if (!n) return 0.;
	if (n != this->Cols()){
		PZError << __PRETTY_FUNCTION__
		<< " - matrix must be square - Rows() = "
		<< this->Rows() << " - Cols() = "
		<< this->Cols() << std::endl;
	}
	switch(p){
		case 0:{
			TVar max = 0.;
			int64_t i, j;
			for(i = 0; i < n; i++){
				REAL sum = 0.;
				for(j = 0; j < n; j++) sum += fabs( this->Get(i,j) );
				if (sum > fabs(max)) max = sum;
			}
			return max;
		}
		case 1:{
			TVar max = 0.;
			int64_t i, j;
			for(i = 0; i < n; i++){
				REAL sum = 0.;
				for(j = 0; j < n; j++) sum += fabs( this->Get(j,i) );
				if (sum > fabs(max)) max = sum;
			}
			return max;
		}
		case 2:{
			TPZFMatrix<TVar> transp(n,n);
			int64_t i, j, k;
			//TRANSPOSE
			for(i = 0; i < n; i++) for(j = 0; j < n; j++) transp(i,j) = this->Get(j,i);
			//MULTIPLY transp = transp.this
			TPZVec<TVar> ROW(n);
			for(i = 0; i < n; i++){
				for(j = 0; j < n; j++) ROW[j] = transp(i,j);
				for(j = 0; j < n; j++){
					TVar sum = 0.;
					for(k = 0; k < n; k++){
						sum += ROW[k] * this->Get(k,j);
					}//for k
					transp(i,j) = sum;
				}//for j
			}//for i
			
			TPZVec<TVar> EigenVal;
			bool result = transp.SolveEigenvaluesJacobi(numiter, tol, &EigenVal);
			if (result == false) PZError << __PRETTY_FUNCTION__
				<< " - it was not possible to find Eigenvalues. Iterations = "
				<< numiter << " - error found = " << tol << std::endl;
			return sqrt(EigenVal[0]);
		}//case 2
		default:{
			PZError << __PRETTY_FUNCTION__ << " p = " << p << " is not a correct option" << std::endl;
		}
	}//switch
	return 0.;
}